

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

bool __thiscall
duckdb_shell::ShellState::SetOutputMode(ShellState *this,char *mode_str,char *tbl_name)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t __n;
  char *zName;
  string *psVar5;
  
  __n = strlen(mode_str);
  cVar1 = *mode_str;
  if (__n < 3 || cVar1 != 'l') {
    if (cVar1 != 't') {
      if (cVar1 == 'h') {
        iVar4 = strncmp(mode_str,"html",__n);
        if (iVar4 == 0) {
          this->mode = HTML;
          goto LAB_001e3f3a;
        }
      }
      else if (cVar1 == 'c') {
        iVar4 = strncmp(mode_str,"columns",__n);
        if (iVar4 == 0) {
          this->mode = COLUMN;
          if ((this->shellFlgs & 0x80) == 0) {
            this->showHeader = true;
          }
          goto LAB_001e3f27;
        }
        iVar4 = strncmp(mode_str,"csv",__n);
        if (iVar4 == 0) {
          this->mode = CSV;
          std::__cxx11::string::assign((char *)&this->colSeparator);
          psVar5 = &this->rowSeparator;
          goto LAB_001e3f35;
        }
      }
LAB_001e3c8d:
      bVar2 = false;
LAB_001e3c8f:
      switch((cVar1 + 0x9fU) * '@' | (byte)(cVar1 + 0x9fU) >> 2) {
      case 0:
switchD_001e3caf_caseD_0:
        iVar4 = strncmp(mode_str,"ascii",__n);
        if (iVar4 == 0) {
          this->mode = ASCII;
          std::__cxx11::string::assign((char *)&this->colSeparator);
          psVar5 = &this->rowSeparator;
          goto LAB_001e3f35;
        }
        if (cVar1 == 'm') goto switchD_001e3caf_caseD_3;
        break;
      case 2:
        iVar4 = strncmp(mode_str,"insert",__n);
        if (iVar4 == 0) {
          this->mode = INSERT;
          zName = "table";
          if (tbl_name != (char *)0x0) {
            zName = tbl_name;
          }
          SetTableName(this,zName);
          goto LAB_001e3f3a;
        }
        if (cVar1 == 'a') goto switchD_001e3caf_caseD_0;
        if (cVar1 == 'm') goto switchD_001e3caf_caseD_3;
        if (cVar1 == 'q') goto switchD_001e3caf_caseD_4;
        break;
      case 3:
switchD_001e3caf_caseD_3:
        iVar4 = strncmp(mode_str,"markdown",__n);
        if (iVar4 == 0) {
          this->mode = MARKDOWN;
          goto LAB_001e3f3a;
        }
        break;
      case 4:
switchD_001e3caf_caseD_4:
        iVar4 = strncmp(mode_str,"quote",__n);
        if (iVar4 == 0) {
          this->mode = QUOTE;
          goto LAB_001e3f22;
        }
        if (cVar1 == 'm') goto switchD_001e3caf_caseD_3;
        if (cVar1 == 'a') goto switchD_001e3caf_caseD_0;
      }
      if ((bVar2) && (iVar4 = strncmp(mode_str,"table",__n), iVar4 == 0)) {
        this->mode = TABLE;
      }
      else {
        if (cVar1 == 'j') {
          iVar4 = strncmp(mode_str,"json",__n);
          bVar3 = true;
          if (iVar4 == 0) {
            this->mode = JSON;
            goto LAB_001e3f3a;
          }
        }
        else {
          if (cVar1 == 'd') {
            iVar4 = strncmp(mode_str,"duckbox",__n);
            if (iVar4 == 0) {
              this->mode = DUCKBOX;
              goto LAB_001e3f3a;
            }
          }
          else if (cVar1 == 'b') {
            iVar4 = strncmp(mode_str,"box",__n);
            if (iVar4 == 0) {
              this->mode = BOX;
              goto LAB_001e3f3a;
            }
          }
          else if ((cVar1 == 'l') && (iVar4 = strncmp(mode_str,"latex",__n), iVar4 == 0)) {
            this->mode = LATEX;
            goto LAB_001e3f3a;
          }
          bVar3 = false;
        }
        if ((bVar2) && (iVar4 = strncmp(mode_str,"trash",__n), iVar4 == 0)) {
          this->mode = TRASH;
        }
        else {
          if ((!bVar3) || (iVar4 = strncmp(mode_str,"jsonlines",__n), iVar4 != 0)) {
            fwrite("Error: mode should be one of: ascii box column csv duckbox html insert json jsonlines latex line list markdown quote table tabs tcl trash \n"
                   ,0x8b,1,_stderr);
            return false;
          }
          this->mode = JSONLINES;
        }
      }
      goto LAB_001e3f3a;
    }
    iVar4 = strncmp(mode_str,"tcl",__n);
    if (iVar4 == 0) {
      this->mode = TCL;
      goto LAB_001e3f22;
    }
    iVar4 = strncmp(mode_str,"tabs",__n);
    bVar2 = true;
    if (iVar4 != 0) goto LAB_001e3c8f;
    this->mode = LIST;
    psVar5 = &this->colSeparator;
  }
  else {
    iVar4 = strncmp(mode_str,"lines",__n);
    if (iVar4 == 0) {
      this->mode = LINE;
    }
    else {
      iVar4 = strncmp(mode_str,"list",__n);
      if (iVar4 != 0) goto LAB_001e3c8d;
      this->mode = LIST;
LAB_001e3f22:
      std::__cxx11::string::assign((char *)&this->colSeparator);
    }
LAB_001e3f27:
    psVar5 = &this->rowSeparator;
  }
LAB_001e3f35:
  std::__cxx11::string::assign((char *)psVar5);
LAB_001e3f3a:
  this->cMode = this->mode;
  return true;
}

Assistant:

bool ShellState::SetOutputMode(const char *mode_str, const char *tbl_name) {
	idx_t n2 = StringLength(mode_str);
	char c2 = mode_str[0];
	if (c2 == 'l' && n2 > 2 && strncmp(mode_str, "lines", n2) == 0) {
		mode = RenderMode::LINE;
		rowSeparator = SEP_Row;
	} else if (c2 == 'c' && strncmp(mode_str, "columns", n2) == 0) {
		mode = RenderMode::COLUMN;
		if ((shellFlgs & SHFLG_HeaderSet) == 0) {
			showHeader = true;
		}
		rowSeparator = SEP_Row;
	} else if (c2 == 'l' && n2 > 2 && strncmp(mode_str, "list", n2) == 0) {
		mode = RenderMode::LIST;
		colSeparator = SEP_Column;
		rowSeparator = SEP_Row;
	} else if (c2 == 'h' && strncmp(mode_str, "html", n2) == 0) {
		mode = RenderMode::HTML;
	} else if (c2 == 't' && strncmp(mode_str, "tcl", n2) == 0) {
		mode = RenderMode::TCL;
		colSeparator = SEP_Space;
		rowSeparator = SEP_Row;
	} else if (c2 == 'c' && strncmp(mode_str, "csv", n2) == 0) {
		mode = RenderMode::CSV;
		colSeparator = SEP_Comma;
		rowSeparator = SEP_CrLf;
	} else if (c2 == 't' && strncmp(mode_str, "tabs", n2) == 0) {
		mode = RenderMode::LIST;
		colSeparator = SEP_Tab;
	} else if (c2 == 'i' && strncmp(mode_str, "insert", n2) == 0) {
		mode = RenderMode::INSERT;
		SetTableName(tbl_name ? tbl_name : "table");
	} else if (c2 == 'q' && strncmp(mode_str, "quote", n2) == 0) {
		mode = RenderMode::QUOTE;
		colSeparator = SEP_Comma;
		rowSeparator = SEP_Row;
	} else if (c2 == 'a' && strncmp(mode_str, "ascii", n2) == 0) {
		mode = RenderMode::ASCII;
		colSeparator = SEP_Unit;
		rowSeparator = SEP_Record;
	} else if (c2 == 'm' && strncmp(mode_str, "markdown", n2) == 0) {
		mode = RenderMode::MARKDOWN;
	} else if (c2 == 't' && strncmp(mode_str, "table", n2) == 0) {
		mode = RenderMode::TABLE;
	} else if (c2 == 'b' && strncmp(mode_str, "box", n2) == 0) {
		mode = RenderMode::BOX;
	} else if (c2 == 'd' && strncmp(mode_str, "duckbox", n2) == 0) {
		mode = RenderMode::DUCKBOX;
	} else if (c2 == 'j' && strncmp(mode_str, "json", n2) == 0) {
		mode = RenderMode::JSON;
	} else if (c2 == 'l' && strncmp(mode_str, "latex", n2) == 0) {
		mode = RenderMode::LATEX;
	} else if (c2 == 't' && strncmp(mode_str, "trash", n2) == 0) {
		mode = RenderMode::TRASH;
	} else if (c2 == 'j' && strncmp(mode_str, "jsonlines", n2) == 0) {
		mode = RenderMode::JSONLINES;
	} else {
		raw_printf(stderr, "Error: mode should be one of: "
		                   "ascii box column csv duckbox html insert json jsonlines latex line "
		                   "list markdown quote table tabs tcl trash \n");
		return false;
	}
	cMode = mode;
	return true;
}